

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_std_file_readAsString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar5;
  long lVar6;
  JSValue JVar7;
  JSValue JVar8;
  uint64_t max_size64;
  DynBuf dbuf;
  int64_t iVar4;
  
  __stream = (FILE *)js_std_file_get(ctx,this_val);
  iVar4 = 6;
  if ((__stream != (FILE *)0x0) &&
     (((uVar5 = 0xffffffffffffffff, argc < 1 || ((int)argv->tag == 3)) ||
      (JVar7.tag = argv->tag, JVar7.u.ptr = (argv->u).ptr, iVar1 = JS_ToIndex(ctx,&max_size64,JVar7)
      , uVar5 = max_size64, iVar1 == 0)))) {
    js_std_dbuf_init(ctx,&dbuf);
    lVar6 = uVar5 + 1;
    do {
      lVar6 = lVar6 + -1;
      if ((lVar6 == 0) || (iVar1 = fgetc(__stream), iVar1 == -1)) {
        JVar7 = JS_NewStringLen(ctx,(char *)dbuf.buf,dbuf.size);
        iVar4 = JVar7.tag;
        dbuf_free(&dbuf);
        uVar3 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
        uVar2 = (ulong)JVar7.u.ptr & 0xffffffff;
        goto LAB_0010de49;
      }
      iVar1 = dbuf_putc(&dbuf,(uint8_t)iVar1);
    } while (iVar1 == 0);
    dbuf_free(&dbuf);
  }
  uVar2 = 0;
  uVar3 = 0;
LAB_0010de49:
  JVar8.u.ptr = (void *)(uVar2 | uVar3);
  JVar8.tag = iVar4;
  return JVar8;
}

Assistant:

static JSValue js_std_file_readAsString(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int c;
    DynBuf dbuf;
    JSValue obj;
    uint64_t max_size64;
    size_t max_size;
    JSValueConst max_size_val;
    
    if (!f)
        return JS_EXCEPTION;

    if (argc >= 1)
        max_size_val = argv[0];
    else
        max_size_val = JS_UNDEFINED;
    max_size = (size_t)-1;
    if (!JS_IsUndefined(max_size_val)) {
        if (JS_ToIndex(ctx, &max_size64, max_size_val))
            return JS_EXCEPTION;
        if (max_size64 < max_size)
            max_size = max_size64;
    }

    js_std_dbuf_init(ctx, &dbuf);
    while (max_size != 0) {
        c = fgetc(f);
        if (c == EOF)
            break;
        if (dbuf_putc(&dbuf, c)) {
            dbuf_free(&dbuf);
            return JS_EXCEPTION;
        }
        max_size--;
    }
    obj = JS_NewStringLen(ctx, (const char *)dbuf.buf, dbuf.size);
    dbuf_free(&dbuf);
    return obj;
}